

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

void sysbvm_functionCallFrameStack_begin
               (sysbvm_context_t *context,sysbvm_functionCallFrameStack_t *callFrameStack,
               sysbvm_tuple_t function,size_t argumentCount,sysbvm_bitflags_t applicationFlags)

{
  sysbvm_bitflags_t sVar1;
  size_t sVar2;
  size_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_functionCallFrameStack_t *function_00;
  sysbvm_context_t *context_00;
  ulong uVar5;
  byte bVar6;
  
  (callFrameStack->gcRoots).function = function;
  function_00 = callFrameStack;
  sVar1 = sysbvm_function_getFlags((sysbvm_context_t *)function,(sysbvm_tuple_t)callFrameStack);
  bVar6 = (byte)(sVar1 >> 1) & 1;
  callFrameStack->isVariadic = (_Bool)bVar6;
  context_00 = (sysbvm_context_t *)function;
  sVar1 = sysbvm_function_getFlags((sysbvm_context_t *)function,(sysbvm_tuple_t)function_00);
  callFrameStack->isMemoizedTemplate = (sVar1 & 0x600) == 0x600;
  callFrameStack->applicationFlags = applicationFlags;
  sVar2 = sysbvm_function_getArgumentCount(context_00,function);
  callFrameStack->expectedArgumentCount = sVar2;
  callFrameStack->variadicArgumentIndex = 0;
  callFrameStack->argumentIndex = 0;
  if ((applicationFlags & 3) != 0) {
    callFrameStack->isVariadic = false;
    bVar6 = false;
  }
  if ((int)(sVar1 & 0x600) == 0x600) {
    sVar3 = sVar2;
    if (sVar2 == 0) {
      sysbvm_error("Memoized template function requires at least a single argument.");
      sVar3 = callFrameStack->expectedArgumentCount;
      bVar6 = callFrameStack->isVariadic;
    }
    callFrameStack->expectedArgumentCount = sVar3 - 1;
    sVar2 = sVar2 - 1;
  }
  if ((bVar6 & 1) == 0) {
    if (sVar2 != argumentCount) {
      sysbvm_error("Function call does not receive the required number of arguments.");
    }
  }
  else {
    if (sVar2 == 0) {
      sysbvm_error("Variadic functions require at least a single argument.");
    }
    uVar5 = sVar2 - 1;
    callFrameStack->variadicArgumentIndex = uVar5;
    if (argumentCount < uVar5) {
      sysbvm_error("Missing required argument count.");
    }
    sVar4 = sysbvm_array_create(context,argumentCount - uVar5);
    (callFrameStack->gcRoots).applicationArguments[callFrameStack->variadicArgumentIndex] = sVar4;
  }
  if ((0x10 < argumentCount) && (callFrameStack->isVariadic == false)) {
    sysbvm_error("Function application direct arguments exceeds the max argument count.");
    return;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_functionCallFrameStack_begin(sysbvm_context_t *context, sysbvm_functionCallFrameStack_t *callFrameStack, sysbvm_tuple_t function, size_t argumentCount, sysbvm_bitflags_t applicationFlags)
{
    callFrameStack->gcRoots.function = function;
    callFrameStack->isVariadic = sysbvm_function_isVariadic(context, callFrameStack->gcRoots.function);
    callFrameStack->isMemoizedTemplate = sysbvm_function_isMemoizedTemplate(context, callFrameStack->gcRoots.function);
    callFrameStack->applicationFlags = applicationFlags;
    callFrameStack->expectedArgumentCount = sysbvm_function_getArgumentCount(context, callFrameStack->gcRoots.function);
    callFrameStack->argumentIndex = 0;
    callFrameStack->variadicArgumentIndex = 0;

    if(applicationFlags & (SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED | SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK))
        callFrameStack->isVariadic = false;

    size_t requiredArgumentCount = callFrameStack->expectedArgumentCount;
    if(callFrameStack->isMemoizedTemplate)
    {
        if(callFrameStack->expectedArgumentCount == 0)
            sysbvm_error("Memoized template function requires at least a single argument.");
        --callFrameStack->expectedArgumentCount;
        --requiredArgumentCount;
    }

    if(callFrameStack->isVariadic)
    {
        if(requiredArgumentCount == 0)
            sysbvm_error("Variadic functions require at least a single argument.");
        callFrameStack->variadicArgumentIndex = requiredArgumentCount - 1;

        --requiredArgumentCount;
        if(argumentCount < requiredArgumentCount)
            sysbvm_error("Missing required argument count.");

        size_t variadicArgumentCount = argumentCount - requiredArgumentCount;
        callFrameStack->gcRoots.applicationArguments[callFrameStack->variadicArgumentIndex] = sysbvm_array_create(context, variadicArgumentCount);
    }
    else
    {
        if(argumentCount != requiredArgumentCount)
            sysbvm_error("Function call does not receive the required number of arguments.");
    }

    if(argumentCount > SYSBVM_MAX_FUNCTION_ARGUMENTS && !callFrameStack->isVariadic)
        sysbvm_error("Function application direct arguments exceeds the max argument count.");
    
}